

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O2

Attribute * Imf_2_5::TypedAttribute<Imath_2_5::Matrix44<double>_>::makeNewAttribute(void)

{
  TypedAttribute<Imath_2_5::Matrix44<double>_> *this;
  
  this = (TypedAttribute<Imath_2_5::Matrix44<double>_> *)operator_new(0x88);
  memset(this,0,0x88);
  TypedAttribute(this);
  return &this->super_Attribute;
}

Assistant:

Attribute *
TypedAttribute<T>::makeNewAttribute ()
{
    return new TypedAttribute<T>();
}